

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmFunctionAccess(ExpressionContext *ctx,VmModule *module,ExprFunctionAccess *node)

{
  VmModule *module_00;
  VmValue *pVVar1;
  VmType VVar2;
  VmConstant *local_48;
  SynBase *local_40;
  TypeBase *local_38;
  VmValue *funcRef;
  VmValue *context;
  ExprFunctionAccess *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if (node->function->vmFunction != (VmFunction *)0x0) {
    if (node->context == (ExprBase *)0x0) {
      local_48 = CreateConstantPointer
                           (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                            ctx->typeNullPtr,false);
    }
    else {
      local_48 = (VmConstant *)CompileVm(ctx,module,node->context);
    }
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar2 = VmType::FunctionRef(&node->function->type->super_TypeBase);
    local_40 = VVar2._0_8_;
    local_38 = VVar2.structType;
    VVar2.structType = (TypeBase *)local_48;
    VVar2._0_8_ = local_38;
    pVVar1 = anon_unknown.dwarf_aa461::CreateConstruct
                       ((anon_unknown_dwarf_aa461 *)module,module_00,local_40,VVar2,
                        &node->function->vmFunction->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                        (VmValue *)module);
    pVVar1 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar1);
    return pVVar1;
  }
  __assert_fail("node->function->vmFunction",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xe70,
                "VmValue *CompileVmFunctionAccess(ExpressionContext &, VmModule *, ExprFunctionAccess *)"
               );
}

Assistant:

VmValue* CompileVmFunctionAccess(ExpressionContext &ctx, VmModule *module, ExprFunctionAccess *node)
{
	assert(node->function->vmFunction);

	VmValue *context = node->context ? CompileVm(ctx, module, node->context) : CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false);

	VmValue *funcRef = CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), context, node->function->vmFunction, NULL, NULL);

	return CheckType(ctx, node, funcRef);
}